

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::updateScene(QGraphicsView *this,QList<QRectF> *rects)

{
  qreal qVar1;
  QWidgetData *pQVar2;
  char cVar3;
  int iVar4;
  QRect *pQVar5;
  QRect *pQVar6;
  QWidget *pQVar7;
  long lVar8;
  uint uVar9;
  QRect *dirtyRect;
  qreal *pqVar10;
  QTransform *pQVar11;
  long lVar12;
  QRectF *rect;
  long in_FS_OFFSET;
  bool bVar13;
  bool bVar14;
  byte bVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  QRect QVar18;
  QRegion updateRegion;
  QTransform transform;
  QRectF local_108;
  QRect local_e8;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  QRect local_c8;
  QRegion local_b0;
  QList<QRect> local_a8;
  QTransform local_88;
  long local_38;
  
  QVar18._8_8_ = local_c8._8_8_;
  QVar18._0_8_ = local_c8._0_8_;
  bVar15 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar12 = *(long *)(this + 8);
  if (((*(byte *)(lVar12 + 0x301) & 0x10) == 0) &&
     (local_c8 = QVar18, *(int *)(lVar12 + 0x484) != 3)) {
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (QRect *)0x0;
    local_a8.d.size = 0;
    iVar4 = QRegion::rectCount();
    QList<QRect>::reserve(&local_a8,(long)iVar4 + (rects->d).size);
    pQVar5 = (QRect *)QRegion::begin();
    pQVar6 = (QRect *)QRegion::end();
    if (pQVar5 != pQVar6) {
      do {
        QtPrivate::QMovableArrayOps<QRect>::emplace<QRect_const&>
                  ((QMovableArrayOps<QRect> *)&local_a8,local_a8.d.size,pQVar5);
        QList<QRect>::end(&local_a8);
        pQVar5 = pQVar5 + 1;
      } while (pQVar5 != pQVar6);
    }
    QRegion::QRegion((QRegion *)&local_88);
    qVar1 = *(qreal *)(lVar12 + 0x528);
    *(qreal *)(lVar12 + 0x528) = local_88.m_matrix[0][0];
    local_88.m_matrix[0][0] = qVar1;
    QRegion::~QRegion((QRegion *)&local_88);
    *(undefined8 *)(lVar12 + 0x530) = 0;
    *(undefined8 *)(lVar12 + 0x538) = 0xffffffffffffffff;
    bVar13 = true;
    bVar14 = true;
    if ((*(byte *)(lVar12 + 0x300) & 0x40) != 0) {
      bVar14 = *(int *)(lVar12 + 0x484) == 0;
    }
    if (*(int *)(lVar12 + 0x484) != 4) {
      if (*(int *)(lVar12 + 0x484) == 2) {
        bVar13 = 0x31 < (ulong)((rects->d).size + local_a8.d.size);
      }
      else {
        bVar13 = false;
      }
    }
    local_b0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&local_b0);
    local_c8.x1.m_i = 0;
    local_c8.y1.m_i = 0;
    local_c8.x2.m_i = -1;
    local_c8.y2.m_i = -1;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    pQVar2 = pQVar7->data;
    puStack_d0._0_4_ = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
    puStack_d0._4_4_ = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
    local_d8 = (undefined1 *)0x0;
    pqVar10 = (qreal *)&DAT_00704bf8;
    pQVar11 = &local_88;
    for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pQVar11->m_matrix[0][0] = *pqVar10;
      pqVar10 = pqVar10 + (ulong)bVar15 * -2 + 1;
      pQVar11 = (QTransform *)((long)pQVar11 + ((ulong)bVar15 * -2 + 1) * 8);
    }
    viewportTransform(&local_88,this);
    lVar8 = (rects->d).size;
    if (lVar8 != 0) {
      lVar8 = lVar8 << 5;
      do {
        local_e8.x1.m_i = -0x55555556;
        local_e8.y1.m_i = -0x55555556;
        local_e8.x2.m_i = -0x55555556;
        local_e8.y2.m_i = -0x55555556;
        QTransform::mapRect(&local_108);
        auVar17 = QRectF::toAlignedRect();
        local_e8.y1.m_i = auVar17._4_4_;
        local_e8.x2.m_i = auVar17._8_4_;
        local_e8.y2.m_i = auVar17._12_4_;
        uVar9 = *(uint *)(lVar12 + 0x488) & 2;
        uVar16 = 0x2fffffffe;
        if (uVar9 != 0) {
          uVar16 = 0x1ffffffff;
        }
        local_e8.x1.m_i = (-(uint)(uVar9 != 0) | 0xfffffffe) + auVar17._0_4_;
        local_e8.y1.m_i = local_e8.y1.m_i + (int)uVar16;
        iVar4 = (int)((ulong)uVar16 >> 0x20);
        local_e8.x2.m_i = local_e8.x2.m_i + iVar4;
        local_e8.y2.m_i = local_e8.y2.m_i + iVar4;
        cVar3 = QRect::intersects((QRect *)&local_d8);
        if (cVar3 != '\0') {
          QtPrivate::QMovableArrayOps<QRect>::emplace<QRect_const&>
                    ((QMovableArrayOps<QRect> *)&local_a8,local_a8.d.size,&local_e8);
          QList<QRect>::end(&local_a8);
        }
        lVar8 = lVar8 + -0x20;
      } while (lVar8 != 0);
    }
    if (local_a8.d.size != 0) {
      lVar12 = local_a8.d.size << 4;
      pQVar5 = local_a8.d.ptr;
      do {
        if (bVar13) {
          QVar18 = (QRect)QRect::operator|(&local_c8,pQVar5);
          local_c8 = QVar18;
        }
        else {
          QRegion::operator+=(&local_b0,pQVar5);
        }
        if (bVar14) goto LAB_006423ec;
        pQVar5 = pQVar5 + 1;
        lVar12 = lVar12 + -0x10;
      } while (lVar12 != 0);
      if (bVar14) {
LAB_006423ec:
        pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
        QWidget::update(pQVar7);
      }
      else {
        pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
        if (bVar13) {
          QWidget::update(pQVar7,&local_c8);
        }
        else {
          QWidget::update(pQVar7,&local_b0);
        }
      }
    }
    QRegion::~QRegion(&local_b0);
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::updateScene(const QList<QRectF> &rects)
{
    // ### Note: Since 4.5, this slot is only called if the user explicitly
    // establishes a connection between the scene and the view, as the scene
    // and view are no longer connected. We need to keep it working (basically
    // leave it as it is), but the new delivery path is through
    // QGraphicsScenePrivate::itemUpdate().
    Q_D(QGraphicsView);
    if (d->fullUpdatePending || d->viewportUpdateMode == QGraphicsView::NoViewportUpdate)
        return;

    // Extract and reset dirty scene rect info.
    QList<QRect> dirtyViewportRects;
    dirtyViewportRects.reserve(d->dirtyRegion.rectCount() + rects.size());
    for (const QRect &dirtyRect : d->dirtyRegion)
        dirtyViewportRects += dirtyRect;
    d->dirtyRegion = QRegion();
    d->dirtyBoundingRect = QRect();

    bool fullUpdate = !d->accelerateScrolling || d->viewportUpdateMode == QGraphicsView::FullViewportUpdate;
    bool boundingRectUpdate = (d->viewportUpdateMode == QGraphicsView::BoundingRectViewportUpdate)
                              || (d->viewportUpdateMode == QGraphicsView::SmartViewportUpdate
                                  && ((dirtyViewportRects.size() + rects.size()) >= QGRAPHICSVIEW_REGION_RECT_THRESHOLD));

    QRegion updateRegion;
    QRect boundingRect;
    QRect viewportRect = viewport()->rect();
    bool redraw = false;
    QTransform transform = viewportTransform();

    // Convert scene rects to viewport rects.
    for (const QRectF &rect : rects) {
        QRect xrect = transform.mapRect(rect).toAlignedRect();
        if (!(d->optimizationFlags & DontAdjustForAntialiasing))
            xrect.adjust(-2, -2, 2, 2);
        else
            xrect.adjust(-1, -1, 1, 1);
        if (!viewportRect.intersects(xrect))
            continue;
        dirtyViewportRects << xrect;
    }

    for (const QRect &rect : std::as_const(dirtyViewportRects)) {
        // Add the exposed rect to the update region. In rect update
        // mode, we only count the bounding rect of items.
        if (!boundingRectUpdate) {
            updateRegion += rect;
        } else {
            boundingRect |= rect;
        }
        redraw = true;
        if (fullUpdate) {
            // If fullUpdate is true and we found a visible dirty rect,
            // we're done.
            break;
        }
    }

    if (!redraw)
        return;

    if (fullUpdate)
        viewport()->update();
    else if (boundingRectUpdate)
        viewport()->update(boundingRect);
    else
        viewport()->update(updateRegion);
}